

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_free(archive_write_filter *f)

{
  void *__ptr;
  private_data_conflict5 *data;
  archive_write_filter *f_local;
  
  __ptr = f->data;
  free(*(void **)((long)__ptr + 0x80));
  free(__ptr);
  f->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_compressor_gzip_free(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

#ifdef HAVE_ZLIB_H
	free(data->compressed);
#else
	__archive_write_program_free(data->pdata);
#endif
	free(data);
	f->data = NULL;
	return (ARCHIVE_OK);
}